

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

SurfaceVertexVectorQuantity * __thiscall
polyscope::SurfaceMesh::addVertexVectorQuantityImpl
          (SurfaceMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  pointer pcVar1;
  SurfaceVertexVectorQuantity *this_00;
  undefined4 in_register_0000000c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *perm;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_68;
  string local_50;
  
  perm = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         CONCAT44(in_register_0000000c,vectorType);
  this_00 = (SurfaceVertexVectorQuantity *)operator_new(0xd0);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  applyPermutation<glm::vec<3,float,(glm::qualifier)0>>
            (&local_68,(polyscope *)vectors,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&this->vertexPerm,perm);
  SurfaceVertexVectorQuantity::SurfaceVertexVectorQuantity
            (this_00,&local_50,&local_68,this,vectorType);
  if (local_68.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  QuantityStructure<polyscope::SurfaceMesh>::addQuantity
            (&this->super_QuantityStructure<polyscope::SurfaceMesh>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

SurfaceVertexVectorQuantity* SurfaceMesh::addVertexVectorQuantityImpl(std::string name,
                                                                      const std::vector<glm::vec3>& vectors,
                                                                      VectorType vectorType) {
  SurfaceVertexVectorQuantity* q =
      new SurfaceVertexVectorQuantity(name, applyPermutation(vectors, vertexPerm), *this, vectorType);
  addQuantity(q);
  return q;
}